

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndices
          (PlanningUnitMADPDiscrete *this,LIndex jaohI)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  undefined4 extraout_var_00;
  LIndex in_RDX;
  PlanningUnitMADPDiscrete *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index this_agentAOHI;
  Index agentI;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivA_vec;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  indivO_vec;
  size_t nrAgents;
  Index t;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *aohI_vec;
  undefined4 in_stack_fffffffffffffec8;
  Index in_stack_fffffffffffffecc;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  uint uVar3;
  undefined4 in_stack_fffffffffffffedc;
  Index IVar4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffef0;
  LIndex in_stack_ffffffffffffff00;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff08;
  uint local_ac;
  undefined1 in_stack_ffffffffffffff58;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff5a;
  undefined4 uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  Index in_stack_ffffffffffffff68;
  Index in_stack_ffffffffffffff6c;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff70;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_88;
  undefined4 local_5c;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_40;
  undefined8 local_28;
  Index local_1c;
  LIndex local_18;
  
  local_18 = in_RDX;
  local_1c = GetTimeStepForJAOHI(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  iVar1 = (*(in_RSI->super_PlanningUnit)._vptr_PlanningUnit[6])();
  local_28 = CONCAT44(extraout_var,iVar1);
  local_5c = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9d7dfc);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,(value_type_conflict1 *)in_stack_fffffffffffffee0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x9d7e32);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
           (value_type *)in_stack_fffffffffffffee0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x9d7e60);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffee0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9d7e7a);
  uVar6 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9d7eb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,(value_type_conflict1 *)in_stack_fffffffffffffee0,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x9d7ee3);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
           (value_type *)in_stack_fffffffffffffee0,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x9d7f11);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffee0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9d7f2b);
  JointAOHIndexToIndividualActionObservationVectors(in_RSI,local_18,&local_40,&local_88);
  uVar5 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x9d7f61);
  local_ac = 0;
  while( true ) {
    uVar2 = (ulong)local_ac;
    iVar1 = (*(in_RSI->super_PlanningUnit)._vptr_PlanningUnit[6])();
    if (CONCAT44(extraout_var_00,iVar1) <= uVar2) break;
    uVar3 = local_ac;
    IVar4 = local_1c;
    in_stack_fffffffffffffee0 =
         (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::at(in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    in_stack_fffffffffffffed0 =
         (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::at(in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    in_stack_fffffffffffffecc =
         GetActionObservationHistoryIndex
                   (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
                    in_stack_ffffffffffffff60,
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(uVar6,CONCAT22(in_stack_ffffffffffffff5a,
                                            CONCAT11(uVar5,in_stack_ffffffffffffff58))));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffee0,
               (value_type_conflict1 *)CONCAT44(IVar4,uVar3));
    local_ac = local_ac + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(in_stack_fffffffffffffee0);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(in_stack_fffffffffffffee0);
  return in_RDI;
}

Assistant:

vector<Index> 
PlanningUnitMADPDiscrete::JointToIndividualActionObservationHistoryIndices(
        LIndex jaohI) const
{
    Index t = GetTimeStepForJAOHI(jaohI);
    //indivO_vec[agentI][t] = oI
    size_t nrAgents = GetNrAgents();
    vector< vector<Index> > indivO_vec(nrAgents, vector<Index>(t, 0));
    vector< vector<Index> > indivA_vec(nrAgents, vector<Index>(t, 0));
    JointAOHIndexToIndividualActionObservationVectors(
            jaohI, indivO_vec, indivA_vec );
    //calculate indiv observation history index from seq. of indiv. observations
    vector<Index> aohI_vec;
    for (Index agentI=0; agentI<GetNrAgents(); agentI++)
    {
        Index this_agentAOHI = GetActionObservationHistoryIndex(agentI, t, 
                            indivA_vec.at(agentI), indivO_vec.at(agentI) );
        aohI_vec.push_back(this_agentAOHI);
    }
    return(aohI_vec);
}